

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O3

void __thiscall
CCollision::MoveBox(CCollision *this,vec2 *pInoutPos,vec2 *pInoutVel,vec2 Size,float Elasticity,
                   bool *pDeath)

{
  vec2 Pos;
  vec2 Pos_00;
  vec2 Pos_01;
  vec2 Pos_02;
  vec2 Size_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar9;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar10;
  float local_c0;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_b8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_b4;
  
  _local_b8 = *pInoutPos;
  local_c0 = (pInoutVel->field_0).x;
  fVar7 = (pInoutVel->field_1).y;
  fVar4 = SQRT(local_c0 * local_c0 + fVar7 * fVar7);
  if (pDeath != (bool *)0x0) {
    *pDeath = false;
  }
  if ((1e-05 < fVar4) && (iVar3 = (int)fVar4, -1 < iVar3)) {
    iVar3 = iVar3 + 1;
    fVar5 = (float)iVar3;
    fVar6 = -Elasticity;
    fVar4 = fVar7;
    do {
      aVar10.x = (1.0 / fVar5) * local_c0 + local_b8.x;
      aVar8.y = aStack_b4.y + (1.0 / fVar5) * fVar4;
      if ((pDeath != (bool *)0x0) &&
         (Pos_02.field_1.y = aVar8.y, Pos_02.field_0.x = aVar10.x,
         Size_00.field_1.y = Size.field_1.y * 0.6666667,
         Size_00.field_0.x = Size.field_0.x * 0.6666667, bVar1 = TestBox(this,Pos_02,Size_00,2),
         bVar1)) {
        *pDeath = true;
      }
      Pos.field_1.y = aVar8.y;
      Pos.field_0.x = aVar10.x;
      bVar1 = TestBox(this,Pos,Size,1);
      if (bVar1) {
        Pos_00.field_1.y = aVar8.y;
        Pos_00.field_0.x = local_b8.x;
        bVar1 = TestBox(this,Pos_00,Size,1);
        aVar9 = aStack_b4;
        if (!bVar1) {
          aVar9.y = aVar8.y;
        }
        fVar7 = fVar4 * fVar6;
        Pos_01.field_1.y = aStack_b4.y;
        Pos_01.field_0.x = aVar10.x;
        bVar2 = TestBox(this,Pos_01,Size,1);
        if (bVar2) {
          if (!bVar1) {
            fVar7 = fVar4;
          }
          local_c0 = local_c0 * fVar6;
          aStack_b4.y = aVar9.y;
        }
        else if (bVar1) {
          local_b8.x = aVar10.x;
        }
        else {
          local_c0 = local_c0 * fVar6;
        }
      }
      else {
        aStack_b4.y = aVar8.y;
        local_b8.x = aVar10.x;
        fVar7 = fVar4;
      }
      iVar3 = iVar3 + -1;
      fVar4 = fVar7;
    } while (iVar3 != 0);
  }
  *pInoutPos = _local_b8;
  (pInoutVel->field_0).x = local_c0;
  (pInoutVel->field_1).y = fVar7;
  return;
}

Assistant:

void CCollision::MoveBox(vec2 *pInoutPos, vec2 *pInoutVel, vec2 Size, float Elasticity, bool *pDeath) const
{
	// do the move
	vec2 Pos = *pInoutPos;
	vec2 Vel = *pInoutVel;

	const float Distance = length(Vel);
	const int Max = (int)Distance;

	if(pDeath)
		*pDeath = false;

	if(Distance > 0.00001f)
	{
		const float Fraction = 1.0f/(Max+1);
		for(int i = 0; i <= Max; i++)
		{
			vec2 NewPos = Pos + Vel*Fraction; // TODO: this row is not nice

			//You hit a deathtile, congrats to that :)
			//Deathtiles are a bit smaller
			if(pDeath && TestBox(vec2(NewPos.x, NewPos.y), Size*(2.0f/3.0f), COLFLAG_DEATH))
			{
				*pDeath = true;
			}

			if(TestBox(vec2(NewPos.x, NewPos.y), Size))
			{
				int Hits = 0;

				if(TestBox(vec2(Pos.x, NewPos.y), Size))
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					Hits++;
				}

				if(TestBox(vec2(NewPos.x, Pos.y), Size))
				{
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
					Hits++;
				}

				// neither of the tests got a collision.
				// this is a real _corner case_!
				if(Hits == 0)
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
				}
			}

			Pos = NewPos;
		}
	}

	*pInoutPos = Pos;
	*pInoutVel = Vel;
}